

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O0

uint8 crnlib::color::clamp_component(int i)

{
  undefined4 local_c;
  int i_local;
  
  local_c = i;
  if (0xff < (uint)i) {
    if (i < 0) {
      local_c = 0;
    }
    else if (0xff < i) {
      local_c = 0xff;
    }
  }
  return (uint8)local_c;
}

Assistant:

static inline uint8 clamp_component(int i)
        {
            if (static_cast<uint>(i) > 255U)
            {
                if (i < 0)
                {
                    i = 0;
                }
                else if (i > 255)
                {
                    i = 255;
                }
            }
            return static_cast<uint8>(i);
        }